

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O1

bool __thiscall
S2ShapeIndexRegion<S2ShapeIndex>::Contains(S2ShapeIndexRegion<S2ShapeIndex> *this,S2Point *p)

{
  Iterator *pIVar1;
  bool bVar2;
  bool bVar3;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  const_reference pvVar4;
  uint n;
  
  bVar2 = S2ShapeIndex::Iterator::Locate(this->iter_,p);
  if (bVar2) {
    this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
              S2ShapeIndex::Iterator::cell(this->iter_);
    bVar2 = ((undefined1  [16])*this_00 & (undefined1  [16])0xffffff) != (undefined1  [16])0x0;
    if (bVar2) {
      pIVar1 = this->iter_;
      pvVar4 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                         (this_00,0);
      bVar3 = S2ContainsPointQuery<S2ShapeIndex>::ShapeContains
                        (&this->contains_query_,pIVar1,pvVar4,p);
      if (!bVar3) {
        n = 1;
        do {
          bVar2 = n < (*(uint *)this_00 & 0xffffff);
          if (!bVar2) {
            return false;
          }
          pIVar1 = this->iter_;
          pvVar4 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                   operator[](this_00,n);
          bVar3 = S2ContainsPointQuery<S2ShapeIndex>::ShapeContains
                            (&this->contains_query_,pIVar1,pvVar4,p);
          n = n + 1;
        } while (!bVar3);
      }
      if (bVar2) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool S2ShapeIndexRegion<IndexType>::Contains(const S2Point& p) const {
  if (iter_.Locate(p)) {
    const S2ShapeIndexCell& cell = iter_.cell();
    for (int s = 0; s < cell.num_clipped(); ++s) {
      if (contains_query_.ShapeContains(iter_, cell.clipped(s), p)) {
        return true;
      }
    }
  }
  return false;
}